

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

BasicBlock * __thiscall flow::IRHandler::createBlock(IRHandler *this,string *name)

{
  reference this_00;
  pointer pBVar1;
  undefined1 local_20 [16];
  string *name_local;
  IRHandler *this_local;
  
  local_20._8_8_ = name;
  name_local = (string *)this;
  std::make_unique<flow::BasicBlock,std::__cxx11::string_const&,flow::IRHandler*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
             (IRHandler **)name);
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
  ::emplace_back<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>
            ((list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
              *)&this->blocks_,
             (unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)local_20);
  std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::~unique_ptr
            ((unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)local_20);
  this_00 = std::__cxx11::
            list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            ::back(&this->blocks_);
  pBVar1 = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::get(this_00);
  return pBVar1;
}

Assistant:

BasicBlock* IRHandler::createBlock(const std::string& name) {
  blocks_.emplace_back(std::make_unique<BasicBlock>(name, this));
  return blocks_.back().get();
}